

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_vec3f ma_vec3f_normalize(ma_vec3f v)

{
  float fVar1;
  float fVar2;
  float fVar4;
  undefined8 uVar3;
  float fVar5;
  float fVar6;
  ma_vec3f mVar7;
  
  fVar5 = v.z;
  fVar1 = v.x;
  fVar4 = v.y;
  fVar2 = SQRT(fVar5 * fVar5 + fVar1 * fVar1 + fVar4 * fVar4);
  fVar6 = 1.0 / fVar2;
  uVar3 = CONCAT44(fVar6 * fVar4,fVar6 * fVar1);
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    uVar3 = 0;
  }
  fVar6 = fVar6 * fVar5;
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    fVar6 = 0.0;
  }
  mVar7.z = fVar6;
  mVar7.x = (float)(int)uVar3;
  mVar7.y = (float)(int)((ulong)uVar3 >> 0x20);
  return mVar7;
}

Assistant:

MA_API ma_vec3f ma_vec3f_normalize(ma_vec3f v)
{
    float f;
    float l = ma_vec3f_len(v);
    if (l == 0) {
        return ma_vec3f_init_3f(0, 0, 0);
    }

    f = 1 / l;
    v.x *= f;
    v.y *= f;
    v.z *= f;

    return v;
}